

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::coap::Message::Serialize
          (Error *__return_storage_ptr__,Message *this,ByteArray *aBuf)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorCode EVar2;
  iterator __position;
  undefined2 aLastOptionNumber;
  _Rb_tree_color _Var3;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar4;
  _Base_ptr p_Var5;
  _List_node_base *p_Var6;
  Message *this_01;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  int iVar7;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uriPathSegments;
  allocator_type local_b9;
  string *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  Message *local_a8;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_a0;
  Error local_98;
  string local_70;
  _Rb_tree_node_base *local_50;
  _List_node_base local_48;
  undefined8 local_38;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_a8 = this;
  local_a0 = (vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf;
  Serialize(&local_98,this,&this->mHeader,aBuf);
  this_01 = (Message *)&local_98.mMessage;
  __return_storage_ptr__->mCode = local_98.mCode;
  std::__cxx11::string::operator=((string *)this_00,(string *)this_01);
  EVar2 = __return_storage_ptr__->mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.mMessage._M_dataplus._M_p != &local_98.mMessage.field_2) {
    operator_delete(local_98.mMessage._M_dataplus._M_p);
  }
  if (EVar2 == kNone) {
    p_Var5 = (local_a8->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_50 = &(local_a8->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_b8 = (string *)this_00;
    local_b0 = paVar1;
    if (p_Var5 != local_50) {
      aLastOptionNumber = _S_red;
      do {
        if ((short)p_Var5[1]._M_color == 0xb) {
          local_38 = 0;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          local_48._M_next = &local_48;
          local_48._M_prev = &local_48;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((string *)&local_70,p_Var5[1]._M_parent,p_Var5[1]._M_left);
          SplitUriPath(&local_98,
                       (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_48,&local_70);
          __return_storage_ptr__->mCode = local_98.mCode;
          this_01 = (Message *)&local_98.mMessage;
          std::__cxx11::string::operator=(local_b8,(string *)this_01);
          EVar2 = __return_storage_ptr__->mCode;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98.mMessage._M_dataplus._M_p != &local_98.mMessage.field_2) {
            operator_delete(local_98.mMessage._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          iVar7 = 4;
          p_Var6 = &local_48;
          if (EVar2 == kNone) {
            while (p_Var6 = (((_List_impl *)&p_Var6->_M_next)->_M_node).super__List_node_base.
                            _M_next, p_Var6 != &local_48) {
              _Var3 = p_Var5[1]._M_color;
              __first._M_current = (char *)p_Var6[1]._M_next;
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_70,__first,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__first._M_current + (long)p_Var6[1]._M_prev),&local_b9);
              Serialize(&local_98,(Message *)__first._M_current,(OptionType)_Var3,
                        (OptionValue *)&local_70,aLastOptionNumber,(ByteArray *)local_a0);
              __return_storage_ptr__->mCode = local_98.mCode;
              this_01 = (Message *)&local_98.mMessage;
              std::__cxx11::string::operator=(local_b8,(string *)this_01);
              EVar2 = __return_storage_ptr__->mCode;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98.mMessage._M_dataplus._M_p != &local_98.mMessage.field_2) {
                operator_delete(local_98.mMessage._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              iVar7 = 4;
              if (EVar2 != kNone) goto LAB_00151a07;
              aLastOptionNumber = (undefined2)p_Var5[1]._M_color;
            }
            iVar7 = 9;
LAB_00151a07:
            if (iVar7 == 9) {
              iVar7 = 0;
            }
          }
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48);
        }
        else {
          Serialize(&local_98,this_01,(OptionType)p_Var5[1]._M_color,
                    (OptionValue *)&p_Var5[1]._M_parent,aLastOptionNumber,(ByteArray *)local_a0);
          __return_storage_ptr__->mCode = local_98.mCode;
          this_01 = (Message *)&local_98.mMessage;
          std::__cxx11::string::operator=(local_b8,(string *)this_01);
          EVar2 = __return_storage_ptr__->mCode;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98.mMessage._M_dataplus._M_p != &local_98.mMessage.field_2) {
            operator_delete(local_98.mMessage._M_dataplus._M_p);
          }
          iVar7 = 4;
          if (EVar2 == kNone) {
            aLastOptionNumber = (undefined2)p_Var5[1]._M_color;
            iVar7 = 0;
          }
        }
        if (iVar7 != 0) goto LAB_00151a42;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != local_50);
    }
    iVar7 = 5;
LAB_00151a42:
    pvVar4 = local_a0;
    if (iVar7 != 4) {
      if (iVar7 == 5) {
        if ((local_a8->mPayload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (local_a8->mPayload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          __position._M_current = *(uchar **)(local_a0 + 8);
          if (__position._M_current == *(uchar **)(local_a0 + 0x10)) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>(local_a0,__position,&kPayloadMarker);
          }
          else {
            *__position._M_current = 0xff;
            *(long *)(local_a0 + 8) = *(long *)(local_a0 + 8) + 1;
          }
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (pvVar4,*(undefined8 *)(pvVar4 + 8),
                     (local_a8->mPayload).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (local_a8->mPayload).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*(undefined1 **)local_b8 != local_b0) {
        operator_delete(*(undefined1 **)local_b8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Serialize(ByteArray &aBuf) const
{
    Error    error;
    uint16_t lastOptionNumber;

    SuccessOrExit(error = Serialize(mHeader, aBuf));

    lastOptionNumber = 0;
    for (const auto &option : mOptions)
    {
        const auto &number = option.first;
        const auto &value  = option.second;
        if (number == OptionType::kUriPath)
        {
            std::list<std::string> uriPathSegments;
            SuccessOrExit(error = SplitUriPath(uriPathSegments, value.GetStringValue()));
            for (const auto &segment : uriPathSegments)
            {
                SuccessOrExit(error = Serialize(number, OptionValue{segment}, lastOptionNumber, aBuf));
                lastOptionNumber = utils::to_underlying(number);
            }
        }
        else
        {
            SuccessOrExit(error = Serialize(number, value, lastOptionNumber, aBuf));
            lastOptionNumber = utils::to_underlying(number);
        }
    }

    if (!mPayload.empty())
    {
        aBuf.push_back(kPayloadMarker);
        aBuf.insert(aBuf.end(), mPayload.begin(), mPayload.end());
    }

exit:
    return error;
}